

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O1

int luaopen_base(lua_State *L)

{
  lua_rawgeti(L,-0xf4628,2);
  lua_rawgeti(L,-0xf4628,2);
  lua_setfield(L,-2,"_G");
  luaL_setfuncs(L,base_funcs,0);
  lua_pushlstring(L,"Lua 5.2",7);
  lua_setfield(L,-2,"_VERSION");
  return 1;
}

Assistant:

LUAMOD_API int luaopen_base (lua_State *L) {
  /* set global _G */
  lua_pushglobaltable(L);
  lua_pushglobaltable(L);
  lua_setfield(L, -2, "_G");
  /* open lib into global table */
  luaL_setfuncs(L, base_funcs, 0);
  lua_pushliteral(L, LUA_VERSION);
  lua_setfield(L, -2, "_VERSION");  /* set global _VERSION */
  return 1;
}